

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool duckdb_snappy::InternalUncompressAllTags<duckdb_snappy::SnappyIOVecWriter>
               (SnappyDecompressor *decompressor,SnappyIOVecWriter *writer,uint32_t compressed_len,
               uint32_t uncompressed_len)

{
  bool bVar1;
  uint in_ECX;
  uint in_EDX;
  SnappyIOVecWriter *in_RSI;
  SnappyDecompressor *in_RDI;
  int token;
  SnappyIOVecWriter *in_stack_00000068;
  SnappyDecompressor *in_stack_00000070;
  bool local_1d;
  
  Report(0,"snappy_uncompress",(ulong)in_EDX,(ulong)in_ECX);
  SnappyIOVecWriter::SetExpectedLength(in_RSI,(ulong)in_ECX);
  SnappyDecompressor::DecompressAllTags<duckdb_snappy::SnappyIOVecWriter>
            (in_stack_00000070,in_stack_00000068);
  SnappyIOVecWriter::Flush(in_RSI);
  bVar1 = SnappyDecompressor::eof(in_RDI);
  local_1d = false;
  if (bVar1) {
    local_1d = SnappyIOVecWriter::CheckLength(in_RSI);
  }
  return local_1d;
}

Assistant:

static bool InternalUncompressAllTags(SnappyDecompressor* decompressor,
                                      Writer* writer, uint32_t compressed_len,
                                      uint32_t uncompressed_len) {
    int token = 0;
  Report(token, "snappy_uncompress", compressed_len, uncompressed_len);

  writer->SetExpectedLength(uncompressed_len);

  // Process the entire input
  decompressor->DecompressAllTags(writer);
  writer->Flush();
  return (decompressor->eof() && writer->CheckLength());
}